

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O1

void sysbvm_orderedCollection_atPut
               (sysbvm_tuple_t orderedCollection,size_t index,sysbvm_tuple_t value)

{
  ulong uVar1;
  
  if (orderedCollection == 0 || (orderedCollection & 0xf) != 0) {
    sysbvm_error_nullArgument();
  }
  uVar1 = *(ulong *)(orderedCollection + 0x10);
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    uVar1 = (long)uVar1 >> 4;
  }
  else {
    uVar1 = *(ulong *)(uVar1 + 0x10);
  }
  if (uVar1 <= index) {
    sysbvm_error_indexOutOfBounds();
  }
  *(sysbvm_tuple_t *)(*(long *)(orderedCollection + 0x18) + 0x10 + index * 8) = value;
  return;
}

Assistant:

SYSBVM_API void sysbvm_orderedCollection_atPut(sysbvm_tuple_t orderedCollection, size_t index, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection)) sysbvm_error_nullArgument();

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    if(index >= size)
        sysbvm_error_indexOutOfBounds();

    ((sysbvm_array_t*)orderedCollectionObject->storage)->elements[index] = value;
}